

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

int uv__udp_recvmmsg(uv_udp_t *handle,uv_buf_t *buf)

{
  uv_udp_recv_cb p_Var1;
  int iVar2;
  int *piVar3;
  bool bVar4;
  uv_buf_t uVar5;
  char *local_8c8;
  char *local_8c0;
  ulong local_8b8;
  size_t k;
  ulong uStack_8a8;
  int flags;
  size_t chunks;
  uv_buf_t chunk_buf;
  ssize_t nread;
  uv__mmsghdr msgs [20];
  iovec iov [20];
  sockaddr_in6 peers [20];
  uv_buf_t *buf_local;
  uv_udp_t *handle_local;
  
  uStack_8a8 = buf->len >> 0x10;
  if (0x14 < uStack_8a8) {
    uStack_8a8 = 0x14;
  }
  for (local_8b8 = 0; local_8b8 < uStack_8a8; local_8b8 = local_8b8 + 1) {
    iov[local_8b8 - 1].iov_len = (size_t)(buf->base + local_8b8 * 0x10000);
    iov[local_8b8].iov_base = (void *)0x10000;
    memset(&msgs[local_8b8 - 1].msg_len,0,0x38);
    *(size_t **)&msgs[local_8b8].msg_hdr.msg_namelen = &iov[local_8b8 - 1].iov_len;
    msgs[local_8b8].msg_hdr.msg_iov = (iovec *)0x1;
    *(undefined1 **)&msgs[local_8b8 - 1].msg_len =
         (undefined1 *)((long)&peers[local_8b8 - 1].sin6_addr.__in6_u + 0xc);
    *(undefined4 *)&msgs[local_8b8].msg_hdr.msg_name = 0x1c;
    msgs[local_8b8].msg_hdr.msg_iovlen = 0;
    msgs[local_8b8].msg_hdr.msg_control = (void *)0x0;
    *(undefined4 *)&msgs[local_8b8].msg_hdr.msg_controllen = 0;
  }
  do {
    iVar2 = uv__recvmmsg((handle->io_watcher).fd,(uv__mmsghdr *)&nread,(uint)uStack_8a8);
    chunk_buf.len = (size_t)iVar2;
    bVar4 = false;
    if (chunk_buf.len == 0xffffffffffffffff) {
      piVar3 = __errno_location();
      bVar4 = *piVar3 == 4;
    }
  } while (bVar4);
  if ((long)chunk_buf.len < 1) {
    if (((chunk_buf.len == 0) || (piVar3 = __errno_location(), *piVar3 == 0xb)) ||
       (piVar3 = __errno_location(), *piVar3 == 0xb)) {
      (*handle->recv_cb)(handle,0,buf,(sockaddr *)0x0,0);
    }
    else {
      p_Var1 = handle->recv_cb;
      piVar3 = __errno_location();
      (*p_Var1)(handle,(long)-*piVar3,buf,(sockaddr *)0x0,0);
    }
  }
  else {
    local_8b8 = 0;
    while( true ) {
      bVar4 = false;
      if (local_8b8 < chunk_buf.len) {
        bVar4 = handle->recv_cb != (uv_udp_recv_cb)0x0;
      }
      if (!bVar4) break;
      k._4_4_ = 8;
      if ((msgs[local_8b8].msg_hdr.msg_controllen & 0x20) != 0) {
        k._4_4_ = 10;
      }
      uVar5 = uv_buf_init((char *)iov[local_8b8 - 1].iov_len,(uint)iov[local_8b8].iov_base);
      local_8c8 = uVar5.base;
      chunks = (size_t)local_8c8;
      local_8c0 = (char *)uVar5.len;
      chunk_buf.base = local_8c0;
      (*handle->recv_cb)(handle,(ssize_t)msgs[local_8b8].msg_hdr.msg_flags,(uv_buf_t *)&chunks,
                         *(sockaddr **)&msgs[local_8b8 - 1].msg_len,k._4_4_);
      local_8b8 = local_8b8 + 1;
    }
    if (handle->recv_cb != (uv_udp_recv_cb)0x0) {
      (*handle->recv_cb)(handle,0,buf,(sockaddr *)0x0,0x10);
    }
  }
  return (int)chunk_buf.len;
}

Assistant:

static int uv__udp_recvmmsg(uv_udp_t* handle, uv_buf_t* buf) {
  struct sockaddr_in6 peers[UV__MMSG_MAXWIDTH];
  struct iovec iov[UV__MMSG_MAXWIDTH];
  struct uv__mmsghdr msgs[UV__MMSG_MAXWIDTH];
  ssize_t nread;
  uv_buf_t chunk_buf;
  size_t chunks;
  int flags;
  size_t k;

  #ifdef __clang_analyzer__
  /* Tell clang-analyzer the array is initialized.
     The part we use is initialized below.  */
  memset(iov, 0, sizeof(iov));
  #endif

  /* prepare structures for recvmmsg */
  chunks = buf->len / UV__UDP_DGRAM_MAXSIZE;
  if (chunks > ARRAY_SIZE(iov))
    chunks = ARRAY_SIZE(iov);
  for (k = 0; k < chunks; ++k) {
    iov[k].iov_base = buf->base + k * UV__UDP_DGRAM_MAXSIZE;
    iov[k].iov_len = UV__UDP_DGRAM_MAXSIZE;
    memset(&msgs[k].msg_hdr, 0, sizeof(msgs[k].msg_hdr));
    msgs[k].msg_hdr.msg_iov = iov + k;
    msgs[k].msg_hdr.msg_iovlen = 1;
    msgs[k].msg_hdr.msg_name = peers + k;
    msgs[k].msg_hdr.msg_namelen = sizeof(peers[0]);
    msgs[k].msg_hdr.msg_control = NULL;
    msgs[k].msg_hdr.msg_controllen = 0;
    msgs[k].msg_hdr.msg_flags = 0;
  }

  do
    nread = uv__recvmmsg(handle->io_watcher.fd, msgs, chunks);
  while (nread == -1 && errno == EINTR);

  if (nread < 1) {
    if (nread == 0 || errno == EAGAIN || errno == EWOULDBLOCK)
      handle->recv_cb(handle, 0, buf, NULL, 0);
    else
      handle->recv_cb(handle, UV__ERR(errno), buf, NULL, 0);
  } else {
    /* pass each chunk to the application */
    for (k = 0; k < (size_t) nread && handle->recv_cb != NULL; k++) {
      flags = UV_UDP_MMSG_CHUNK;
      if (msgs[k].msg_hdr.msg_flags & MSG_TRUNC)
        flags |= UV_UDP_PARTIAL;

      chunk_buf = uv_buf_init(iov[k].iov_base, iov[k].iov_len);
      handle->recv_cb(handle,
                      msgs[k].msg_len,
                      &chunk_buf,
                      msgs[k].msg_hdr.msg_name,
                      flags);
    }

    /* one last callback so the original buffer is freed */
    if (handle->recv_cb != NULL)
      handle->recv_cb(handle, 0, buf, NULL, UV_UDP_MMSG_FREE);
  }
  return nread;
}